

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::flush
          (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *this)

{
  HalfCycles duration_00;
  HalfCycles duration;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *this_local;
  
  if ((this->is_flushed_ & 1U) == 0) {
    this->is_flushed_ = true;
    this->did_flush_ = true;
    duration_00 = WrappedInt<HalfCycles>::flush<HalfCycles>
                            (&(this->time_since_update_).super_WrappedInt<HalfCycles>);
    Atari::ST::Video::run_for(&this->object_,duration_00);
  }
  return;
}

Assistant:

forceinline void flush() {
			if(!is_flushed_) {
				did_flush_ = is_flushed_ = true;
				if constexpr (divider == 1) {
					const auto duration = time_since_update_.template flush<TargetTimeScale>();
					object_.run_for(duration);
				} else {
					const auto duration = time_since_update_.template divide<TargetTimeScale>(LocalTimeScale(divider));
					if(duration > TargetTimeScale(0))
						object_.run_for(duration);
				}
			}
		}